

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O2

void __thiscall cmCTestMultiProcessHandler::CheckResume(cmCTestMultiProcessHandler *this)

{
  bool bVar1;
  int index;
  ostream *poVar2;
  istream *piVar3;
  string fname;
  string line;
  ifstream fin;
  
  cmCTest::GetBinaryDir_abi_cxx11_((string *)&fin,this->CTest);
  std::operator+(&fname,(string *)&fin,"/Testing/Temporary/CTestCheckpoint.txt");
  std::__cxx11::string::~string((string *)&fin);
  bVar1 = cmCTest::GetFailover(this->CTest);
  if (bVar1) {
    bVar1 = cmsys::SystemTools::FileExists(&fname,true);
    if (bVar1) {
      poVar2 = std::operator<<(this->TestHandler->LogFile,"Resuming previously interrupted test set"
                              );
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<(poVar2,"----------------------------------------------------------");
      std::endl<char,std::char_traits<char>>(poVar2);
      std::ifstream::ifstream(&fin);
      std::ifstream::open((char *)&fin,(_Ios_Openmode)fname._M_dataplus._M_p);
      line._M_dataplus._M_p = (pointer)&line.field_2;
      line._M_string_length = 0;
      line.field_2._M_local_buf[0] = '\0';
      while( true ) {
        piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&fin,(string *)&line);
        if (((&piVar3->field_0x20)[(long)piVar3->_vptr_basic_istream[-3]] & 5) != 0) break;
        index = atoi(line._M_dataplus._M_p);
        RemoveTest(this,index);
      }
      std::ifstream::close();
      std::__cxx11::string::~string((string *)&line);
      std::ifstream::~ifstream(&fin);
    }
  }
  else {
    bVar1 = cmsys::SystemTools::FileExists(&fname,true);
    if (bVar1) {
      cmsys::SystemTools::RemoveFile(&fname);
    }
  }
  std::__cxx11::string::~string((string *)&fname);
  return;
}

Assistant:

void cmCTestMultiProcessHandler::CheckResume()
{
  std::string fname =
    this->CTest->GetBinaryDir() + "/Testing/Temporary/CTestCheckpoint.txt";
  if (this->CTest->GetFailover()) {
    if (cmSystemTools::FileExists(fname, true)) {
      *this->TestHandler->LogFile
        << "Resuming previously interrupted test set" << std::endl
        << "----------------------------------------------------------"
        << std::endl;

      cmsys::ifstream fin;
      fin.open(fname.c_str());
      std::string line;
      while (std::getline(fin, line)) {
        int index = atoi(line.c_str());
        this->RemoveTest(index);
      }
      fin.close();
    }
  } else if (cmSystemTools::FileExists(fname, true)) {
    cmSystemTools::RemoveFile(fname);
  }
}